

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::RgbaInputFile::setFrameBuffer(RgbaInputFile *this,Rgba *base,size_t xStride,size_t yStride)

{
  RgbaChannels RVar1;
  size_t xst;
  size_t yst;
  long in_RCX;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  FrameBuffer fb;
  size_t ys;
  size_t xs;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffdb4;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  string local_1f8 [32];
  Slice local_1d8;
  string local_1a0 [32];
  Slice local_180;
  string local_148 [32];
  Slice local_128;
  string local_f0 [80];
  string *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  Rgba *in_stack_ffffffffffffff78;
  FromYca *in_stack_ffffffffffffff80;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    xst = in_RDX << 3;
    yst = in_RCX << 3;
    FrameBuffer::FrameBuffer((FrameBuffer *)0x22242a);
    RVar1 = channels((RgbaInputFile *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0))
    ;
    if ((RVar1 & WRITE_Y) == 0) {
      std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      uVar3 = 0;
      uVar2 = 0;
      Slice::Slice(&local_128,HALF,in_RSI,xst,yst,1,1,0.0,false,false);
      FrameBuffer::insert((FrameBuffer *)CONCAT44(RVar1,in_stack_fffffffffffffdc0),
                          (string *)CONCAT44(in_stack_fffffffffffffdbc,uVar3),
                          (Slice *)CONCAT44(in_stack_fffffffffffffdb4,uVar2));
      std::__cxx11::string::~string(local_f0);
      std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      uVar3 = 0;
      uVar2 = 0;
      Slice::Slice(&local_180,HALF,in_RSI + 2,xst,yst,1,1,0.0,false,false);
      FrameBuffer::insert((FrameBuffer *)CONCAT44(RVar1,in_stack_fffffffffffffdc0),
                          (string *)CONCAT44(in_stack_fffffffffffffdbc,uVar3),
                          (Slice *)CONCAT44(in_stack_fffffffffffffdb4,uVar2));
      std::__cxx11::string::~string(local_148);
      std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      uVar3 = 0;
      uVar2 = 0;
      Slice::Slice(&local_1d8,HALF,in_RSI + 4,xst,yst,1,1,0.0,false,false);
      FrameBuffer::insert((FrameBuffer *)CONCAT44(RVar1,in_stack_fffffffffffffdc0),
                          (string *)CONCAT44(in_stack_fffffffffffffdbc,uVar3),
                          (Slice *)CONCAT44(in_stack_fffffffffffffdb4,uVar2));
      std::__cxx11::string::~string(local_1a0);
    }
    else {
      std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      uVar3 = 0;
      uVar2 = 0;
      Slice::Slice((Slice *)(local_f0 + 0x20),HALF,in_RSI,xst,yst,1,1,0.0,false,false);
      FrameBuffer::insert((FrameBuffer *)CONCAT44(RVar1,in_stack_fffffffffffffdc0),
                          (string *)CONCAT44(in_stack_fffffffffffffdbc,uVar3),
                          (Slice *)CONCAT44(in_stack_fffffffffffffdb4,uVar2));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    }
    std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    uVar4 = 0;
    uVar3 = 0;
    uVar2 = 1;
    Slice::Slice((Slice *)&stack0xfffffffffffffdd0,HALF,in_RSI + 6,xst,yst,1,1,1.0,false,false);
    FrameBuffer::insert((FrameBuffer *)CONCAT44(RVar1,in_stack_fffffffffffffdc0),
                        (string *)CONCAT44(in_stack_fffffffffffffdbc,uVar4),
                        (Slice *)CONCAT44(in_stack_fffffffffffffdb4,uVar3));
    std::__cxx11::string::~string(local_1f8);
    InputPart::setFrameBuffer
              ((InputPart *)CONCAT44(in_stack_fffffffffffffdb4,uVar3),
               (FrameBuffer *)CONCAT44(in_stack_fffffffffffffdac,uVar2));
    FrameBuffer::~FrameBuffer((FrameBuffer *)0x222812);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (mutex_type *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    FromYca::setFrameBuffer
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2223ca);
  }
  return;
}

Assistant:

void
RgbaInputFile::setFrameBuffer (Rgba* base, size_t xStride, size_t yStride)
{
    if (_fromYca)
    {
        std::lock_guard<std::mutex> lock (*_fromYca);
        _fromYca->setFrameBuffer (base, xStride, yStride, _channelNamePrefix);
    }
    else
    {
        size_t xs = xStride * sizeof (Rgba);
        size_t ys = yStride * sizeof (Rgba);

        FrameBuffer fb;

        if (channels () & WRITE_Y)
        {
            fb.insert (
                _channelNamePrefix + "Y",
                Slice (
                    HALF,
                    (char*) &base[0].r,
                    xs,
                    ys,
                    1,
                    1,     // xSampling, ySampling
                    0.0)); // fillValue
        }
        else
        {

            fb.insert (
                _channelNamePrefix + "R",
                Slice (
                    HALF,
                    (char*) &base[0].r,
                    xs,
                    ys,
                    1,
                    1,     // xSampling, ySampling
                    0.0)); // fillValue

            fb.insert (
                _channelNamePrefix + "G",
                Slice (
                    HALF,
                    (char*) &base[0].g,
                    xs,
                    ys,
                    1,
                    1,     // xSampling, ySampling
                    0.0)); // fillValue

            fb.insert (
                _channelNamePrefix + "B",
                Slice (
                    HALF,
                    (char*) &base[0].b,
                    xs,
                    ys,
                    1,
                    1,     // xSampling, ySampling
                    0.0)); // fillValue
        }
        fb.insert (
            _channelNamePrefix + "A",
            Slice (
                HALF,
                (char*) &base[0].a,
                xs,
                ys,
                1,
                1,     // xSampling, ySampling
                1.0)); // fillValue

        _inputPart->setFrameBuffer (fb);
    }
}